

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignReader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::CampaignReader::EndStep(CampaignReader *this)

{
  ostream *poVar1;
  long in_RDI;
  
  if ((*(byte *)(in_RDI + 0x130) & 1) != 0) {
    PerformGets(this);
  }
  if (1 < *(int *)(in_RDI + 0xc4)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Campaign Reader ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RDI + 0x128));
    std::operator<<(poVar1,"   EndStep()\n");
  }
  return;
}

Assistant:

void CampaignReader::EndStep()
{
    // EndStep should call PerformGets() if there are unserved GetDeferred()
    // requests
    if (m_NeedPerformGets)
    {
        PerformGets();
    }

    if (m_Options.verbose > 1)
    {
        std::cout << "Campaign Reader " << m_ReaderRank << "   EndStep()\n";
    }
}